

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O1

void __thiscall
FIX::Initiator::Initiator
          (Initiator *this,Application *application,MessageStoreFactory *messageStoreFactory,
          SessionSettings *settings)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  this->_vptr_Initiator = (_func_int **)&PTR__Initiator_001ee2f0;
  p_Var1 = &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_sessionIDs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_pending)._M_t._M_impl.super__Rb_tree_header;
  (this->m_pending)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_pending)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_pending)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_pending)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_pending)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_connected)._M_t._M_impl.super__Rb_tree_header;
  (this->m_connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_connected)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_disconnected)._M_t._M_impl.super__Rb_tree_header;
  (this->m_disconnected)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_disconnected)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_disconnected)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_disconnected)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_disconnected)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_sessionState)._M_t._M_impl.super__Rb_tree_header;
  (this->m_sessionState)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_sessionState)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_sessionState)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_sessionState)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_sessionState)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_threadid = 0;
  this->m_application = application;
  this->m_messageStoreFactory = messageStoreFactory;
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  ::_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
              *)&this->m_settings,
             (_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
              *)settings);
  (this->m_settings).m_defaults._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001ed618;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->m_settings).m_defaults.m_data._M_t,&(settings->m_defaults).m_data._M_t);
  (this->m_settings).m_defaults.m_name._M_dataplus._M_p =
       (pointer)&(this->m_settings).m_defaults.m_name.field_2;
  pcVar2 = (settings->m_defaults).m_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_settings).m_defaults.m_name,pcVar2,
             pcVar2 + (settings->m_defaults).m_name._M_string_length);
  (this->m_settings).m_resolveEnvVars = settings->m_resolveEnvVars;
  this->m_pLogFactory = (LogFactory *)0x0;
  this->m_pLog = (Log *)0x0;
  (this->m_nullLog).super_Log._vptr_Log = (_func_int **)&PTR__Log_001ed648;
  this->m_firstPoll = true;
  this->m_stop = true;
  (this->m_mutex).m_count = 0;
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_init((pthread_mutex_t *)&this->m_mutex,(pthread_mutexattr_t *)0x0);
  initialize(this);
  return;
}

Assistant:

Initiator::Initiator( Application& application,
                      MessageStoreFactory& messageStoreFactory,
                      const SessionSettings& settings ) EXCEPT ( ConfigError )
: m_threadid( 0 ),
  m_application( application ),
  m_messageStoreFactory( messageStoreFactory ),
  m_settings( settings ),
  m_pLogFactory( 0 ),
  m_pLog( 0 ),
  m_firstPoll( true ),
  m_stop( true )
{ initialize(); }